

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O3

void __thiscall
TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test::testBody
          (TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test *this)

{
  WiningState *this_00;
  PlayerHand *this_01;
  _Rb_tree_header *p_Var1;
  set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *this_02;
  _Rb_tree_color _Var2;
  pointer pTVar3;
  pointer pTVar4;
  UtestShell *pUVar5;
  char *pcVar6;
  char *pcVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  DoubligFactorCounter *this_03;
  TestTerminatorWithoutExceptions local_170;
  vector<mahjong::Meld,_std::allocator<mahjong::Meld>_> local_168;
  DoublingFactorReport local_148;
  DoublingFactorReport local_b8;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s;
  mahjong::WiningState::setRoundWind(this_00,EastWind);
  mahjong::WiningState::setSeatWind(this_00,SouthWind);
  this_01 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h;
  mahjong::PlayerHand::add(this_01,WhiteDragon);
  mahjong::PlayerHand::add(this_01,WhiteDragon);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,OneOfCharacters,true);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,TwoOfCircles,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,TwoOfBamboos,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,EastWind,false);
  mahjong::WiningState::selfDrawn(this_00,(SelfDrawnSituation)0x0);
  this_03 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c;
  mahjong::DoubligFactorCounter::report(&local_b8,this_03);
  if (local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
  goto LAB_0016b391;
  p_Var1 = &local_b8.patterns._M_t._M_impl.super__Rb_tree_header;
  p_Var11 = &p_Var1->_M_header;
  p_Var10 = local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    p_Var9 = p_Var10;
    p_Var13 = p_Var11;
    _Var2 = p_Var9[1]._M_color;
    p_Var11 = p_Var9;
    if ((int)_Var2 < 0xe) {
      p_Var11 = p_Var13;
    }
    p_Var10 = (&p_Var9->_M_left)[(int)_Var2 < 0xe];
  } while ((&p_Var9->_M_left)[(int)_Var2 < 0xe] != (_Base_ptr)0x0);
  p_Var10 = local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var12 = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var11 == p_Var1) {
LAB_0016b293:
    do {
      p_Var9 = p_Var12;
      p_Var11 = p_Var10;
      _Var2 = p_Var11[1]._M_color;
      p_Var12 = p_Var11;
      if ((int)_Var2 < 0xe) {
        p_Var12 = p_Var9;
      }
      p_Var10 = (&p_Var11->_M_left)[(int)_Var2 < 0xe];
    } while ((&p_Var11->_M_left)[(int)_Var2 < 0xe] != (_Base_ptr)0x0);
    p_Var10 = local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var13 = &p_Var1->_M_header;
    p_Var8 = &p_Var1->_M_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var1) {
      if ((int)_Var2 < 0xe) {
        p_Var11 = p_Var9;
      }
      p_Var8 = p_Var12;
      if (0xe < (int)p_Var11[1]._M_color) {
        p_Var8 = &p_Var1->_M_header;
      }
    }
    do {
      p_Var9 = p_Var13;
      p_Var11 = p_Var10;
      _Var2 = p_Var11[1]._M_color;
      p_Var13 = p_Var11;
      if ((int)_Var2 < 0xe) {
        p_Var13 = p_Var9;
      }
      p_Var10 = (&p_Var11->_M_left)[(int)_Var2 < 0xe];
    } while ((&p_Var11->_M_left)[(int)_Var2 < 0xe] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var13 == p_Var1) {
      if ((_Rb_tree_header *)p_Var8 != p_Var1) goto LAB_0016b36c;
    }
    else {
      if ((int)_Var2 < 0xe) {
        p_Var11 = p_Var9;
      }
      if (0xe < (int)p_Var11[1]._M_color == ((_Rb_tree_header *)p_Var8 != p_Var1)) {
LAB_0016b36c:
        pUVar5 = UtestShell::getCurrent();
        (*pUVar5->_vptr_UtestShell[0x1b])
                  (pUVar5,
                   "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                   ,0x1df);
      }
    }
LAB_0016b391:
    pUVar5 = UtestShell::getCurrent();
    StringFrom((int)&local_148);
    pcVar6 = SimpleString::asCharString((SimpleString *)&local_148);
    for (p_Var11 = local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 != (_Base_ptr)0x0; p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < 0xe]) {
    }
    StringFrom((unsigned_long)&local_168);
    pcVar7 = SimpleString::asCharString((SimpleString *)&local_168);
    local_170.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1df,&local_170);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_170);
    SimpleString::~SimpleString((SimpleString *)&local_168);
    SimpleString::~SimpleString((SimpleString *)&local_148);
  }
  else {
    if ((int)_Var2 < 0xe) {
      p_Var9 = p_Var13;
    }
    if (0xe < (int)p_Var9[1]._M_color) goto LAB_0016b293;
    pUVar5 = UtestShell::getCurrent();
    local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1df,&local_148);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_148);
  }
  if (local_b8.doubling_factor == 1) {
    pUVar5 = UtestShell::getCurrent();
    local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e0,&local_148);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_148);
  }
  else {
    pUVar5 = UtestShell::getCurrent();
    StringFrom((int)&local_148);
    pcVar6 = SimpleString::asCharString((SimpleString *)&local_148);
    StringFrom((int)&local_168);
    pcVar7 = SimpleString::asCharString((SimpleString *)&local_168);
    local_170.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e0,&local_170);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_170);
    SimpleString::~SimpleString((SimpleString *)&local_168);
    SimpleString::~SimpleString((SimpleString *)&local_148);
  }
  mahjong::WiningState::setSeatWind(this_00,EastWind);
  mahjong::DoubligFactorCounter::report(&local_148,this_03);
  local_168.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_b8.wining_hand.pairs.
                super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_b8.wining_hand.pairs.
                super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_168.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_b8.wining_hand.pairs.
                super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                super__Vector_impl_data._M_start;
  this_02 = &local_b8.patterns;
  local_b8.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b8.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&local_168);
  local_168.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_168.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b8.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_b8.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_148.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b8.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_148.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_148.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&local_168);
  pTVar4 = local_b8.wining_hand.tiles.
           super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pTVar3 = local_b8.wining_hand.tiles.
           super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b8.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b8.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3,(long)pTVar4 - (long)pTVar3);
  }
  local_b8.wining_hand.last_tile = local_148.wining_hand.last_tile;
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::clear(&this_02->_M_t);
  if (local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_148.patterns._M_t._M_impl.super__Rb_tree_header;
    local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header;
    local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  local_b8.bonus_tile_count = local_148.bonus_tile_count;
  local_b8.doubling_factor = local_148.doubling_factor;
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&local_148.patterns._M_t);
  if (local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.wining_hand.tiles.
                    super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&local_148.wining_hand.melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&local_148);
  if (local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
  goto LAB_0016b88e;
  p_Var11 = &local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var10 = local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    p_Var9 = p_Var10;
    p_Var13 = p_Var11;
    _Var2 = p_Var9[1]._M_color;
    p_Var11 = p_Var9;
    if ((int)_Var2 < 0x12) {
      p_Var11 = p_Var13;
    }
    p_Var10 = (&p_Var9->_M_left)[(int)_Var2 < 0x12];
  } while ((&p_Var9->_M_left)[(int)_Var2 < 0x12] != (_Base_ptr)0x0);
  if ((_Rb_tree_header *)p_Var11 == &local_b8.patterns._M_t._M_impl.super__Rb_tree_header) {
LAB_0016b778:
    p_Var11 = local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var10 = &local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      p_Var13 = p_Var10;
      p_Var9 = p_Var11;
      _Var2 = p_Var9[1]._M_color;
      p_Var10 = p_Var9;
      if ((int)_Var2 < 0x12) {
        p_Var10 = p_Var13;
      }
      p_Var11 = (&p_Var9->_M_left)[(int)_Var2 < 0x12];
    } while ((&p_Var9->_M_left)[(int)_Var2 < 0x12] != (_Base_ptr)0x0);
    p_Var11 = &local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var12 = local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var8 = p_Var11;
    if (p_Var10 != p_Var11) {
      if ((int)_Var2 < 0x12) {
        p_Var9 = p_Var13;
      }
      p_Var8 = p_Var10;
      if (0x12 < (int)p_Var9[1]._M_color) {
        p_Var8 = p_Var11;
      }
    }
    do {
      p_Var9 = p_Var11;
      p_Var10 = p_Var12;
      _Var2 = p_Var10[1]._M_color;
      p_Var11 = p_Var10;
      if ((int)_Var2 < 0x12) {
        p_Var11 = p_Var9;
      }
      p_Var12 = (&p_Var10->_M_left)[(int)_Var2 < 0x12];
    } while ((&p_Var10->_M_left)[(int)_Var2 < 0x12] != (_Base_ptr)0x0);
    p_Var1 = &local_b8.patterns._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var11 == p_Var1) {
      if ((_Rb_tree_header *)p_Var8 != p_Var1) goto LAB_0016b869;
    }
    else {
      if ((int)_Var2 < 0x12) {
        p_Var10 = p_Var9;
      }
      if (0x12 < (int)p_Var10[1]._M_color == ((_Rb_tree_header *)p_Var8 != p_Var1)) {
LAB_0016b869:
        pUVar5 = UtestShell::getCurrent();
        (*pUVar5->_vptr_UtestShell[0x1b])
                  (pUVar5,
                   "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                   ,0x1e5);
      }
    }
LAB_0016b88e:
    pUVar5 = UtestShell::getCurrent();
    StringFrom((int)&local_148);
    pcVar6 = SimpleString::asCharString((SimpleString *)&local_148);
    for (p_Var11 = local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 != (_Base_ptr)0x0; p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < 0x12]) {
    }
    StringFrom((unsigned_long)&local_168);
    pcVar7 = SimpleString::asCharString((SimpleString *)&local_168);
    local_170.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e5,&local_170);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_170);
    SimpleString::~SimpleString((SimpleString *)&local_168);
    SimpleString::~SimpleString((SimpleString *)&local_148);
  }
  else {
    if ((int)_Var2 < 0x12) {
      p_Var9 = p_Var13;
    }
    if (0x12 < (int)p_Var9[1]._M_color) goto LAB_0016b778;
    pUVar5 = UtestShell::getCurrent();
    local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e5,&local_148);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_148);
  }
  if (local_b8.doubling_factor == 2) {
    pUVar5 = UtestShell::getCurrent();
    local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e6,&local_148);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_148);
  }
  else {
    pUVar5 = UtestShell::getCurrent();
    StringFrom((int)&local_148);
    pcVar6 = SimpleString::asCharString((SimpleString *)&local_148);
    StringFrom((int)&local_168);
    pcVar7 = SimpleString::asCharString((SimpleString *)&local_168);
    local_170.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e6,&local_170);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_170);
    SimpleString::~SimpleString((SimpleString *)&local_168);
    SimpleString::~SimpleString((SimpleString *)&local_148);
  }
  mahjong::WiningState::setRoundWind(this_00,SouthWind);
  mahjong::DoubligFactorCounter::report(&local_148,this_03);
  local_168.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_b8.wining_hand.pairs.
                super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_b8.wining_hand.pairs.
                super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_168.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_b8.wining_hand.pairs.
                super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_b8.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b8.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&local_168);
  local_168.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_168.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b8.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_b8.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_148.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b8.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_148.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_148.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&local_168);
  pTVar4 = local_b8.wining_hand.tiles.
           super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pTVar3 = local_b8.wining_hand.tiles.
           super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b8.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b8.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3,(long)pTVar4 - (long)pTVar3);
  }
  local_b8.wining_hand.last_tile = local_148.wining_hand.last_tile;
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::clear(&this_02->_M_t);
  if (local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_148.patterns._M_t._M_impl.super__Rb_tree_header;
    local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header;
    local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_148.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  local_b8.bonus_tile_count = local_148.bonus_tile_count;
  local_b8.doubling_factor = local_148.doubling_factor;
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&local_148.patterns._M_t);
  if (local_148.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.wining_hand.tiles.
                    super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&local_148.wining_hand.melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&local_148);
  if (local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_b8.patterns._M_t._M_impl.super__Rb_tree_header;
    p_Var11 = &p_Var1->_M_header;
    p_Var10 = local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      p_Var9 = p_Var10;
      p_Var13 = p_Var11;
      _Var2 = p_Var9[1]._M_color;
      p_Var11 = p_Var9;
      if ((int)_Var2 < 0xe) {
        p_Var11 = p_Var13;
      }
      p_Var10 = (&p_Var9->_M_left)[(int)_Var2 < 0xe];
    } while ((&p_Var9->_M_left)[(int)_Var2 < 0xe] != (_Base_ptr)0x0);
    p_Var10 = local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var12 = &p_Var1->_M_header;
    if ((_Rb_tree_header *)p_Var11 != p_Var1) {
      if ((int)_Var2 < 0xe) {
        p_Var9 = p_Var13;
      }
      if ((int)p_Var9[1]._M_color < 0xf) {
        pUVar5 = UtestShell::getCurrent();
        local_148.wining_hand.pairs.
        super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e18b8;
        (*pUVar5->_vptr_UtestShell[0xe])
                  (pUVar5,0,0,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                   ,0x1eb,&local_148);
        TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
                  ((TestTerminatorWithoutExceptions *)&local_148);
        goto LAB_0016be94;
      }
    }
    do {
      p_Var9 = p_Var12;
      p_Var11 = p_Var10;
      _Var2 = p_Var11[1]._M_color;
      p_Var12 = p_Var11;
      if ((int)_Var2 < 0xe) {
        p_Var12 = p_Var9;
      }
      p_Var10 = (&p_Var11->_M_left)[(int)_Var2 < 0xe];
    } while ((&p_Var11->_M_left)[(int)_Var2 < 0xe] != (_Base_ptr)0x0);
    p_Var10 = local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var13 = &p_Var1->_M_header;
    p_Var8 = &p_Var1->_M_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var1) {
      if ((int)_Var2 < 0xe) {
        p_Var11 = p_Var9;
      }
      p_Var8 = p_Var12;
      if (0xe < (int)p_Var11[1]._M_color) {
        p_Var8 = &p_Var1->_M_header;
      }
    }
    do {
      p_Var9 = p_Var13;
      p_Var11 = p_Var10;
      _Var2 = p_Var11[1]._M_color;
      p_Var13 = p_Var11;
      if ((int)_Var2 < 0xe) {
        p_Var13 = p_Var9;
      }
      p_Var10 = (&p_Var11->_M_left)[(int)_Var2 < 0xe];
    } while ((&p_Var11->_M_left)[(int)_Var2 < 0xe] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var13 == p_Var1) {
      if ((_Rb_tree_header *)p_Var8 != p_Var1) goto LAB_0016bd6d;
    }
    else {
      if ((int)_Var2 < 0xe) {
        p_Var11 = p_Var9;
      }
      if (0xe < (int)p_Var11[1]._M_color == ((_Rb_tree_header *)p_Var8 != p_Var1)) {
LAB_0016bd6d:
        pUVar5 = UtestShell::getCurrent();
        (*pUVar5->_vptr_UtestShell[0x1b])
                  (pUVar5,
                   "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                   ,0x1eb);
      }
    }
  }
  pUVar5 = UtestShell::getCurrent();
  StringFrom((int)&local_148);
  pcVar6 = SimpleString::asCharString((SimpleString *)&local_148);
  for (p_Var11 = local_b8.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 != (_Base_ptr)0x0; p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < 0xe]) {
  }
  StringFrom((unsigned_long)&local_168);
  pcVar7 = SimpleString::asCharString((SimpleString *)&local_168);
  local_170.super_TestTerminator._vptr_TestTerminator =
       (TestTerminator)&PTR_exitCurrentTest_001e18b8;
  (*pUVar5->_vptr_UtestShell[0x16])
            (pUVar5,1,pcVar6,pcVar7,0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
             ,0x1eb,&local_170);
  TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_170);
  SimpleString::~SimpleString((SimpleString *)&local_168);
  SimpleString::~SimpleString((SimpleString *)&local_148);
LAB_0016be94:
  if (local_b8.doubling_factor == 1) {
    pUVar5 = UtestShell::getCurrent();
    local_148.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1ec,&local_148);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_148);
  }
  else {
    pUVar5 = UtestShell::getCurrent();
    StringFrom((int)&local_148);
    pcVar6 = SimpleString::asCharString((SimpleString *)&local_148);
    StringFrom((int)&local_168);
    pcVar7 = SimpleString::asCharString((SimpleString *)&local_168);
    local_170.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1ec,&local_170);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_170);
    SimpleString::~SimpleString((SimpleString *)&local_168);
    SimpleString::~SimpleString((SimpleString *)&local_148);
  }
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&this_02->_M_t);
  if (local_b8.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.wining_hand.tiles.
                    super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&local_b8.wining_hand.melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&local_b8);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, HonorTiles_Wind)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::WhiteDragon);
	addSequence(Tile::OneOfCharacters, true);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);
	addTriplet(Tile::EastWind, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::EastWind));
	CHECK_EQUAL(1, r.doubling_factor);

	s.setSeatWind(Tile::EastWind);	
	r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::DoubleEastWind));
	CHECK_EQUAL(2, r.doubling_factor);

	s.setRoundWind(Tile::SouthWind);
	r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::EastWind));
	CHECK_EQUAL(1, r.doubling_factor);
}